

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

void __thiscall
Assimp::COBImporter::ReadCame_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  short sVar4;
  Node *pNVar5;
  _Elt_pointer psVar6;
  ChunkInfo *pCVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  chunk_guard cn;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  chunk_guard local_48;
  shared_ptr<Assimp::COB::Node> local_30;
  
  if (2 < nfo->version) {
    UnsupportedChunk_Binary(this,reader,nfo,"Came");
    return;
  }
  local_48.cur = (long)(*(int *)&reader->current - *(int *)&reader->buffer);
  pCVar7 = nfo;
  local_48.nfo = nfo;
  local_48.reader = reader;
  pNVar5 = (Node *)operator_new(0xd8);
  COB::Node::Node(pNVar5,TYPE_CAMERA);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_008300d0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::COB::Camera*>
            (&_Stack_50,(Camera *)pNVar5);
  local_30.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_50._M_pi;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pNVar5;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,&local_30);
  if (local_30.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_00._M_pi = _Stack_50._M_pi;
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  psVar6 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar6 == (out->nodes).
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pCVar7 = (ChunkInfo *)
             (out->nodes).
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
    psVar6 = (_Elt_pointer)(*(long *)&pCVar7[-1].version + 0x200);
  }
  pNVar5 = psVar6[-1].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = nfo->parent_id;
  uVar2 = nfo->version;
  uVar3 = nfo->size;
  (pNVar5->super_ChunkInfo).id = nfo->id;
  (pNVar5->super_ChunkInfo).parent_id = uVar1;
  (pNVar5->super_ChunkInfo).version = uVar2;
  (pNVar5->super_ChunkInfo).size = uVar3;
  ReadBasicNodeInfo_Binary((COBImporter *)this_00._M_pi,pNVar5,reader,pCVar7);
  if (1 < nfo->version) {
    sVar4 = StreamReader<false,_false>::Get<short>(reader);
    if (sVar4 == 0x200) {
      StreamReader<false,_false>::IncPtr(reader,0x2a);
    }
  }
  chunk_guard::~chunk_guard(&local_48);
  return;
}

Assistant:

void COBImporter::ReadCame_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 2) {
        return UnsupportedChunk_Binary(reader,nfo,"Came");
    }

    const chunk_guard cn(nfo,reader);

    out.nodes.push_back(std::shared_ptr<Camera>(new Camera()));
    Camera& msh = (Camera&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Binary(msh,reader,nfo);

    // the rest is not interesting for us, so we skip over it.
    if(nfo.version > 1) {
        if (reader.GetI2()==512) {
            reader.IncPtr(42);
        }
    }
}